

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGear.cpp
# Opt level: O3

void __thiscall
chrono::ChShaftsGear::IntLoadConstraint_C
          (ChShaftsGear *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined7 in_register_00000009;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = this->ratio;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = ((this->super_ChShaftsCouple).shaft1)->pos - this->phase1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = ((this->super_ChShaftsCouple).shaft2)->pos - this->phase2;
  auVar6 = vfmsub231sd_fma(auVar10,auVar9,auVar6);
  dVar7 = (double)((ulong)(this->avoid_phase_drift & 1) * auVar6._0_8_) * c;
  if ((int)CONCAT71(in_register_00000009,do_clamp) != 0) {
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar3._8_8_ = in_XMM1_Qb;
    auVar3._0_8_ = recovery_clamp;
    auVar6 = vxorpd_avx512vl(auVar3,auVar2);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar7;
    auVar6 = vmaxsd_avx(auVar8,auVar6);
    auVar4._8_8_ = in_XMM1_Qb;
    auVar4._0_8_ = recovery_clamp;
    auVar6 = vminsd_avx(auVar6,auVar4);
    dVar7 = auVar6._0_8_;
  }
  uVar5 = (ulong)off_L;
  if ((long)uVar5 <
      (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar1[uVar5] = dVar7 + pdVar1[uVar5];
    return;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChShaftsGear::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                       ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                       const double c,            // a scaling factor
                                       bool do_clamp,             // apply clamping to c*C?
                                       double recovery_clamp      // value for min/max clamping of c*C
                                       ) {
    double res = this->ratio * (this->shaft1->GetPos() - phase1) + 
                 -1.0        * (this->shaft2->GetPos() - phase2);
    if (!avoid_phase_drift) 
        res = 0;

    double cnstr_violation = c * res;

    if (do_clamp) {
        cnstr_violation = ChMin(ChMax(cnstr_violation, -recovery_clamp), recovery_clamp);
    }

    Qc(off_L) += cnstr_violation;
}